

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_upper_bounds.cpp
# Opt level: O1

double __thiscall despot::MDPUpperBound::Value(MDPUpperBound *this,Belief *belief)

{
  double dVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar4;
  ulong uVar5;
  double dVar6;
  long *plVar3;
  
  iVar2 = (*belief->_vptr_Belief[6])(belief);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  lVar4 = *plVar3;
  if (plVar3[1] == lVar4) {
    dVar6 = 0.0;
  }
  else {
    dVar6 = 0.0;
    uVar5 = 0;
    do {
      dVar1 = *(double *)(*(long *)(lVar4 + uVar5 * 8) + 0x18);
      iVar2 = (*this->indexer_->_vptr_StateIndexer[3])();
      dVar6 = dVar6 + dVar1 * (this->policy_).
                              super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar2].value;
      uVar5 = uVar5 + 1;
      lVar4 = *plVar3;
    } while (uVar5 < (ulong)(plVar3[1] - lVar4 >> 3));
  }
  return dVar6;
}

Assistant:

double MDPUpperBound::Value(const Belief* belief) const {
	const vector<State*>& particles =
		static_cast<const ParticleBelief*>(belief)->particles();

	double value = 0;
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		value += particle->weight * policy_[indexer_.GetIndex(particle)].value;
	}
	return value;
}